

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

ParquetColumnSchema * __thiscall
duckdb::ParquetReader::ParseSchemaRecursive
          (ParquetColumnSchema *__return_storage_ptr__,ParquetReader *this,idx_t depth,
          idx_t max_define,idx_t max_repeat,idx_t *next_schema_idx,idx_t *next_file_idx)

{
  idx_t iVar1;
  idx_t max_repeat_00;
  string *__k;
  type tVar2;
  idx_t schema_index;
  pointer pPVar3;
  bool bVar4;
  byte bVar5;
  type tVar6;
  FileMetaData *pFVar7;
  const_reference s_ele;
  idx_t max_define_00;
  ParquetFileMetadataCache *pPVar8;
  pointer this_00;
  unsigned_long uVar9;
  pointer pPVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  const_reference pvVar13;
  reference pvVar14;
  LogicalType *pLVar15;
  InvalidInputException *this_01;
  IOException *pIVar16;
  byte bVar17;
  type tVar18;
  ulong uVar19;
  int val;
  idx_t max_repeat_01;
  LogicalType result_type;
  vector<duckdb::ParquetColumnSchema,_true> child_schemas;
  ParquetColumnSchema root_schema;
  LogicalType result_type_1;
  LogicalType local_270 [24];
  LogicalType local_258 [24];
  LogicalType local_240 [24];
  LogicalType local_228 [24];
  case_insensitive_map_t<idx_t> name_collision_count;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_1d8;
  LogicalType local_1c0 [24];
  string local_1a8;
  LogicalType local_188 [24];
  string local_170;
  LogicalType local_150 [24];
  string local_138;
  LogicalType local_118 [24];
  string local_100;
  string local_e0;
  ParquetColumnSchema local_c0;
  
  pFVar7 = GetFileMetadata(this);
  s_ele = vector<duckdb_parquet::SchemaElement,_true>::get<true>(&pFVar7->schema,*next_schema_idx);
  schema_index = *next_schema_idx;
  tVar6 = REQUIRED;
  if (schema_index != 0) {
    tVar6 = s_ele->repetition_type;
  }
  tVar18 = REQUIRED;
  if (((ushort)s_ele->__isset & 4) != 0) {
    tVar18 = tVar6;
  }
  iVar1 = max_define + 1;
  max_define_00 = iVar1;
  if (tVar18 == REQUIRED) {
    max_define_00 = max_define;
  }
  max_repeat_00 = max_repeat + 1;
  max_repeat_01 = max_repeat;
  if (tVar18 == REPEATED) {
    max_repeat_01 = max_repeat_00;
  }
  if (depth == 1) {
    pPVar8 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(&this->metadata);
    if ((pPVar8->geo_metadata).
        super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
        .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl !=
        (GeoParquetFileMetadata *)0x0) {
      pPVar8 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(&this->metadata);
      this_00 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                ::operator->(&pPVar8->geo_metadata);
      bVar4 = GeoParquetFileMetadata::IsGeometryColumn(this_00,&s_ele->name);
      if (bVar4) {
        iVar1 = *next_file_idx;
        *next_file_idx = iVar1 + 1;
        ParseColumnSchema(&root_schema,this,s_ele,max_define_00,max_repeat_01,schema_index,iVar1,
                          COLUMN);
        ParquetColumnSchema::ParquetColumnSchema(&local_c0,&root_schema);
        GeoParquetFileMetadata::GeometryType();
        ParquetColumnSchema::ParquetColumnSchema
                  (__return_storage_ptr__,&local_c0,local_228,GEOMETRY);
        duckdb::LogicalType::~LogicalType(local_228);
        ParquetColumnSchema::~ParquetColumnSchema(&local_c0);
        goto LAB_002ed0c3;
      }
    }
  }
  if ((((ushort)s_ele->__isset & 8) == 0) || (val = s_ele->num_children, val < 1)) {
    if (((ushort)s_ele->__isset & 1) == 0) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&root_schema,
                 "Node \'%s\' has neither num_children nor type set - this violates the Parquet spec (corrupted file)"
                 ,(allocator *)&name_collision_count);
      InvalidInputException::InvalidInputException<char_const*>
                (this_01,(string *)&root_schema,(s_ele->name)._M_dataplus._M_p);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = *next_file_idx;
    *next_file_idx = iVar1 + 1;
    ParseColumnSchema(&root_schema,this,s_ele,max_define_00,max_repeat_01,schema_index,iVar1,COLUMN)
    ;
    if (s_ele->repetition_type == REPEATED) {
      duckdb::LogicalType::LIST((LogicalType *)&name_collision_count);
      std::__cxx11::string::string((string *)&local_1a8,(string *)&s_ele->name);
      duckdb::LogicalType::LogicalType(local_1c0,(LogicalType *)&name_collision_count);
      ParquetColumnSchema::ParquetColumnSchema
                (__return_storage_ptr__,&local_1a8,local_1c0,max_define_00,max_repeat_01,
                 schema_index,*next_file_idx,COLUMN);
      duckdb::LogicalType::~LogicalType(local_1c0);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>
                (&(__return_storage_ptr__->children).
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ,&root_schema);
      duckdb::LogicalType::~LogicalType((LogicalType *)&name_collision_count);
    }
    else {
      ParquetColumnSchema::ParquetColumnSchema(__return_storage_ptr__,&root_schema);
    }
LAB_002ed0c3:
    ParquetColumnSchema::~ParquetColumnSchema(&root_schema);
    return __return_storage_ptr__;
  }
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar19 = 0; uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val),
      pPVar3 = child_schemas.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               .
               super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               ._M_impl.super__Vector_impl_data._M_finish, uVar19 < uVar9; uVar19 = uVar19 + 1) {
    *next_schema_idx = *next_schema_idx + 1;
    ParseSchemaRecursive
              (&root_schema,this,depth + 1,max_define_00,max_repeat_01,next_schema_idx,next_file_idx
              );
    std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    emplace_back<duckdb::ParquetColumnSchema>
              (&child_schemas.
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               ,&root_schema);
    ParquetColumnSchema::~ParquetColumnSchema(&root_schema);
    val = s_ele->num_children;
  }
  name_collision_count._M_h._M_buckets = &name_collision_count._M_h._M_single_bucket;
  name_collision_count._M_h._M_bucket_count = 1;
  name_collision_count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  name_collision_count._M_h._M_element_count = 0;
  name_collision_count._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  name_collision_count._M_h._M_rehash_policy._M_next_resize = 0;
  name_collision_count._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (pPVar10 = child_schemas.
                 super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 .
                 super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ._M_impl.super__Vector_impl_data._M_start; pPVar10 != pPVar3; pPVar10 = pPVar10 + 1
      ) {
    __k = &pPVar10->name;
    while (iVar11 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&name_collision_count._M_h,__k),
          iVar11.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&name_collision_count._M_h,__k);
      *pmVar12 = *pmVar12 + 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &result_type,__k,"_");
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&name_collision_count._M_h,__k);
      std::__cxx11::to_string((string *)&result_type_1,*pmVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &root_schema,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &result_type,(string *)&result_type_1);
      std::__cxx11::string::operator=((string *)__k,(string *)&root_schema);
      std::__cxx11::string::~string((string *)&root_schema);
      std::__cxx11::string::~string((string *)&result_type_1);
      std::__cxx11::string::~string((string *)&result_type);
    }
    std::__cxx11::string::_M_assign((string *)__k);
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&name_collision_count._M_h,__k);
    *pmVar12 = 0;
  }
  bVar17 = SUB21(s_ele->__isset,0);
  tVar2 = s_ele->converted_type;
  bVar5 = tVar2 == MAP_KEY_VALUE & bVar17 >> 4;
  if ((~bVar5 & schema_index != 0) == 0) {
    if (bVar5 != 0) goto LAB_002ed25b;
  }
  else {
    pvVar13 = vector<duckdb_parquet::SchemaElement,_true>::get<true>
                        (&pFVar7->schema,schema_index - 1);
    if ((((~*(uint *)&pvVar13->__isset & 0x18) == 0) && (pvVar13->converted_type == MAP)) &&
       (pvVar13->num_children == 1)) {
LAB_002ed25b:
      if ((long)child_schemas.
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                .
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)child_schemas.
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                .
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x120) {
        pIVar16 = (IOException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&root_schema,"MAP_KEY_VALUE requires two children",
                   (allocator *)&result_type);
        duckdb::IOException::IOException(pIVar16,(string *)&root_schema);
        __cxa_throw(pIVar16,&IOException::typeinfo,std::runtime_error::~runtime_error);
      }
      if (tVar18 != REPEATED) {
        pIVar16 = (IOException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&root_schema,"MAP_KEY_VALUE needs to be repeated",
                   (allocator *)&result_type);
        duckdb::IOException::IOException(pIVar16,(string *)&root_schema);
        __cxa_throw(pIVar16,&IOException::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar14 = vector<duckdb::ParquetColumnSchema,_true>::get<true>(&child_schemas,0);
      duckdb::LogicalType::LogicalType(local_240,&pvVar14->type);
      pvVar14 = vector<duckdb::ParquetColumnSchema,_true>::get<true>(&child_schemas,1);
      duckdb::LogicalType::LogicalType(local_258,&pvVar14->type);
      duckdb::LogicalType::MAP(&result_type,local_240,local_258);
      duckdb::LogicalType::~LogicalType(local_258);
      duckdb::LogicalType::~LogicalType(local_240);
      std::__cxx11::string::string((string *)&local_e0,(string *)&s_ele->name);
      pLVar15 = (LogicalType *)duckdb::ListType::GetChildType(&result_type);
      duckdb::LogicalType::LogicalType(local_270,pLVar15);
      ParquetColumnSchema::ParquetColumnSchema
                (&root_schema,&local_e0,local_270,max_define,max_repeat,schema_index,*next_file_idx,
                 COLUMN);
      duckdb::LogicalType::~LogicalType(local_270);
      std::__cxx11::string::~string((string *)&local_e0);
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      _M_move_assign(&root_schema.children.
                      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ,&child_schemas);
      std::__cxx11::string::string((string *)&local_100,(string *)&s_ele->name);
      duckdb::LogicalType::LogicalType(local_118,&result_type);
      ParquetColumnSchema::ParquetColumnSchema
                (__return_storage_ptr__,&local_100,local_118,iVar1,max_repeat_00,schema_index,
                 *next_file_idx,COLUMN);
      duckdb::LogicalType::~LogicalType(local_118);
      std::__cxx11::string::~string((string *)&local_100);
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>
                (&(__return_storage_ptr__->children).
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ,&root_schema);
      ParquetColumnSchema::~ParquetColumnSchema(&root_schema);
      duckdb::LogicalType::~LogicalType(&result_type);
      goto LAB_002ed6da;
    }
  }
  ParquetColumnSchema::ParquetColumnSchema(__return_storage_ptr__);
  pPVar3 = child_schemas.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((ulong)(((long)child_schemas.
                      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      .
                      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)child_schemas.
                     super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     .
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x90) < 2) &&
     ((bVar17 >> 4 & (tVar2 & ~MAP_KEY_VALUE) == MAP) != 0 || tVar18 == REPEATED)) {
    pvVar14 = vector<duckdb::ParquetColumnSchema,_true>::get<true>(&child_schemas,0);
    ParquetColumnSchema::operator=(__return_storage_ptr__,pvVar14);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
  }
  else {
    _result_type = (pointer)0x0;
    for (pPVar10 = child_schemas.
                   super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                   .
                   super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                   ._M_impl.super__Vector_impl_data._M_start; pPVar10 != pPVar3;
        pPVar10 = pPVar10 + 1) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&root_schema,&pPVar10->name,&pPVar10->type);
      std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&result_type,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&root_schema);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
               *)&root_schema);
    }
    local_1d8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)_result_type;
    local_1d8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _result_type = (pointer)0x0;
    duckdb::LogicalType::STRUCT(&result_type_1);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(&local_1d8);
    std::__cxx11::string::string((string *)&local_138,(string *)&s_ele->name);
    duckdb::LogicalType::LogicalType(local_150,&result_type_1);
    ParquetColumnSchema::ParquetColumnSchema
              (&root_schema,&local_138,local_150,max_define_00,max_repeat_01,schema_index,
               *next_file_idx,COLUMN);
    duckdb::LogicalType::~LogicalType(local_150);
    std::__cxx11::string::~string((string *)&local_138);
    std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    _M_move_assign(&root_schema.children.
                    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                   ,&child_schemas);
    ParquetColumnSchema::operator=(__return_storage_ptr__,&root_schema);
    ParquetColumnSchema::~ParquetColumnSchema(&root_schema);
    duckdb::LogicalType::~LogicalType(&result_type_1);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&result_type);
  }
  if (tVar18 == REPEATED) {
    duckdb::LogicalType::LIST(&result_type);
    std::__cxx11::string::string((string *)&local_170,(string *)&s_ele->name);
    duckdb::LogicalType::LogicalType(local_188,&result_type);
    ParquetColumnSchema::ParquetColumnSchema
              (&root_schema,&local_170,local_188,iVar1,max_repeat_00,schema_index,*next_file_idx,
               COLUMN);
    duckdb::LogicalType::~LogicalType(local_188);
    std::__cxx11::string::~string((string *)&local_170);
    std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    emplace_back<duckdb::ParquetColumnSchema>
              (&root_schema.children.
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               ,__return_storage_ptr__);
    ParquetColumnSchema::operator=(__return_storage_ptr__,&root_schema);
    ParquetColumnSchema::~ParquetColumnSchema(&root_schema);
    duckdb::LogicalType::~LogicalType(&result_type);
  }
  optional_idx::optional_idx((optional_idx *)&root_schema,schema_index);
  (__return_storage_ptr__->parent_schema_index).index = root_schema._0_8_;
LAB_002ed6da:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&name_collision_count._M_h);
  std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&child_schemas.
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ParquetColumnSchema ParquetReader::ParseSchemaRecursive(idx_t depth, idx_t max_define, idx_t max_repeat,
                                                        idx_t &next_schema_idx, idx_t &next_file_idx) {

	auto file_meta_data = GetFileMetadata();
	D_ASSERT(file_meta_data);
	D_ASSERT(next_schema_idx < file_meta_data->schema.size());
	auto &s_ele = file_meta_data->schema[next_schema_idx];
	auto this_idx = next_schema_idx;

	auto repetition_type = FieldRepetitionType::REQUIRED;
	if (s_ele.__isset.repetition_type && this_idx > 0) {
		repetition_type = s_ele.repetition_type;
	}
	if (repetition_type != FieldRepetitionType::REQUIRED) {
		max_define++;
	}
	if (repetition_type == FieldRepetitionType::REPEATED) {
		max_repeat++;
	}

	// Check for geoparquet spatial types
	if (depth == 1) {
		// geoparquet types have to be at the root of the schema, and have to be present in the kv metadata
		if (metadata->geo_metadata && metadata->geo_metadata->IsGeometryColumn(s_ele.name)) {
			auto root_schema = ParseColumnSchema(s_ele, max_define, max_repeat, this_idx, next_file_idx++);
			return ParquetColumnSchema(std::move(root_schema), GeoParquetFileMetadata::GeometryType(),
			                           ParquetColumnSchemaType::GEOMETRY);
		}
	}

	if (s_ele.__isset.num_children && s_ele.num_children > 0) { // inner node
		vector<ParquetColumnSchema> child_schemas;

		idx_t c_idx = 0;
		while (c_idx < NumericCast<idx_t>(s_ele.num_children)) {
			next_schema_idx++;

			auto child_schema = ParseSchemaRecursive(depth + 1, max_define, max_repeat, next_schema_idx, next_file_idx);
			child_schemas.push_back(std::move(child_schema));
			c_idx++;
		}
		// rename child type entries if there are case-insensitive duplicates by appending _1, _2 etc.
		// behavior consistent with CSV reader fwiw
		case_insensitive_map_t<idx_t> name_collision_count;
		for (auto &child_schema : child_schemas) {
			auto &col_name = child_schema.name;
			// avoid duplicate header names
			while (name_collision_count.find(col_name) != name_collision_count.end()) {
				name_collision_count[col_name] += 1;
				col_name = col_name + "_" + to_string(name_collision_count[col_name]);
			}
			child_schema.name = col_name;
			name_collision_count[col_name] = 0;
		}

		bool is_repeated = repetition_type == FieldRepetitionType::REPEATED;
		bool is_list = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::LIST;
		bool is_map = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::MAP;
		bool is_map_kv = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::MAP_KEY_VALUE;
		if (!is_map_kv && this_idx > 0) {
			// check if the parent node of this is a map
			auto &p_ele = file_meta_data->schema[this_idx - 1];
			bool parent_is_map = p_ele.__isset.converted_type && p_ele.converted_type == ConvertedType::MAP;
			bool parent_has_children = p_ele.__isset.num_children && p_ele.num_children == 1;
			is_map_kv = parent_is_map && parent_has_children;
		}

		if (is_map_kv) {
			if (child_schemas.size() != 2) {
				throw IOException("MAP_KEY_VALUE requires two children");
			}
			if (!is_repeated) {
				throw IOException("MAP_KEY_VALUE needs to be repeated");
			}
			auto result_type = LogicalType::MAP(child_schemas[0].type, child_schemas[1].type);
			ParquetColumnSchema struct_schema(s_ele.name, ListType::GetChildType(result_type), max_define - 1,
			                                  max_repeat - 1, this_idx, next_file_idx);
			struct_schema.children = std::move(child_schemas);

			ParquetColumnSchema map_schema(s_ele.name, std::move(result_type), max_define, max_repeat, this_idx,
			                               next_file_idx);
			map_schema.children.push_back(std::move(struct_schema));
			return map_schema;
		}
		ParquetColumnSchema result;
		if (child_schemas.size() > 1 || (!is_list && !is_map && !is_repeated)) {
			child_list_t<LogicalType> struct_types;
			for (auto &child_schema : child_schemas) {
				struct_types.emplace_back(make_pair(child_schema.name, child_schema.type));
			}

			auto result_type = LogicalType::STRUCT(std::move(struct_types));
			ParquetColumnSchema struct_schema(s_ele.name, std::move(result_type), max_define, max_repeat, this_idx,
			                                  next_file_idx);
			struct_schema.children = std::move(child_schemas);
			result = std::move(struct_schema);
		} else {
			// if we have a struct with only a single type, pull up
			result = std::move(child_schemas[0]);
			result.name = s_ele.name;
		}
		if (is_repeated) {
			auto list_type = LogicalType::LIST(result.type);
			ParquetColumnSchema list_schema(s_ele.name, std::move(list_type), max_define, max_repeat, this_idx,
			                                next_file_idx);
			list_schema.children.push_back(std::move(result));
			result = std::move(list_schema);
		}
		result.parent_schema_index = this_idx;
		return result;
	} else { // leaf node
		if (!s_ele.__isset.type) {
			throw InvalidInputException(
			    "Node '%s' has neither num_children nor type set - this violates the Parquet spec (corrupted file)",
			    s_ele.name.c_str());
		}
		auto result = ParseColumnSchema(s_ele, max_define, max_repeat, this_idx, next_file_idx++);
		if (s_ele.repetition_type == FieldRepetitionType::REPEATED) {
			auto list_type = LogicalType::LIST(result.type);
			ParquetColumnSchema list_schema(s_ele.name, std::move(list_type), max_define, max_repeat, this_idx,
			                                next_file_idx);
			list_schema.children.push_back(std::move(result));
			return list_schema;
		}
		return result;
	}
}